

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_malloc.c
# Opt level: O0

char * zt_strdup_p(char *string)

{
  char *pcVar1;
  char *in_RDI;
  char *new_string;
  char *in_stack_00000ff8;
  uint in_stack_00001004;
  char *in_stack_00001008;
  char *in_stack_00001010;
  
  if (in_RDI == (char *)0x0) {
    _zt_log_assertion(in_stack_00001010,in_stack_00001008,in_stack_00001004,in_stack_00000ff8);
    abort();
  }
  pcVar1 = strdup(in_RDI);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  _zt_log_assertion(in_stack_00001010,in_stack_00001008,in_stack_00001004,in_stack_00000ff8);
  abort();
}

Assistant:

char *
zt_strdup_p(const char *string)
{
    char * volatile new_string = NULL;

    zt_assert_always(string);
    new_string = strdup(string);
    zt_assert_always(new_string);

    return new_string;
}